

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# separable_info.c
# Opt level: O3

double inform_separable_info
                 (int *srcs,int *dest,size_t l,size_t n,size_t m,int b,size_t k,inform_error *err)

{
  _Bool _Var1;
  double dVar2;
  double dVar3;
  
  if (l == 0) {
    dVar3 = NAN;
    if (err != (inform_error *)0x0) {
      *err = INFORM_ENOSOURCES;
    }
  }
  else {
    dVar2 = inform_active_info(dest,n,m,b,k,err);
    _Var1 = inform_failed(err);
    dVar3 = NAN;
    if (!_Var1) {
      dVar3 = dVar2;
      do {
        dVar2 = inform_transfer_entropy(srcs,dest,(int *)0x0,0,n,m,b,k,err);
        _Var1 = inform_failed(err);
        if (_Var1) {
          return NAN;
        }
        dVar3 = dVar3 + dVar2;
        srcs = srcs + m * n;
        l = l - 1;
      } while (l != 0);
    }
  }
  return dVar3;
}

Assistant:

double inform_separable_info(int const *srcs, int const *dest, size_t l,
    size_t n, size_t m, int b, size_t k, inform_error *err)
{
    if (l < 1) INFORM_ERROR_RETURN(err, INFORM_ENOSOURCES, NAN);

    double si = inform_active_info(dest, n, m, b, k, err);
    if (inform_failed(err)) return NAN;

    for (size_t i = 0; i < l; ++i, srcs += n*m)
    {
        si += inform_transfer_entropy(srcs, dest, NULL, 0, n, m, b, k, err);
        if (inform_failed(err)) return NAN;
    }

    return si;
}